

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::PathTypeHandlerBase::MoveAuxSlotsToObjectHeader(PathTypeHandlerBase *this,DynamicObject *object)

{
  ushort uVar1;
  undefined8 uVar2;
  code *pcVar3;
  bool bVar4;
  uint16 uVar5;
  int iVar6;
  undefined4 *puVar7;
  Var pvVar8;
  Var pvVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x35d,"(object)","object");
    if (!bVar4) goto LAB_00dbe529;
    *puVar7 = 0;
  }
  bVar4 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(&this->super_DynamicTypeHandler);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x35e,"(!this->IsObjectHeaderInlinedTypeHandler())",
                                "Already ObjectHeaderInlined?");
    if (!bVar4) goto LAB_00dbe529;
    *puVar7 = 0;
  }
  bVar4 = DynamicObject::HasObjectArray(object);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x35f,"(!object->HasObjectArray())",
                                "Can\'t move auxSlots to inline when we have ObjectArray");
    if (!bVar4) goto LAB_00dbe529;
    *puVar7 = 0;
  }
  if ((uint)((this->super_DynamicTypeHandler).unusedBytes >> 1) -
      (uint)(this->super_DynamicTypeHandler).inlineSlotCapacity != 3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x364,
                                "(this->GetUnusedBytesValue() - this->GetInlineSlotCapacity() == 3)"
                                ,"Should have only 3 values in auxSlot");
    if (!bVar4) goto LAB_00dbe529;
    *puVar7 = 0;
  }
  pvVar8 = DynamicObject::GetAuxSlot(object,0);
  pvVar9 = DynamicObject::GetAuxSlot(object,1);
  uVar1 = (this->super_DynamicTypeHandler).offsetOfInlineSlots;
  uVar5 = DynamicTypeHandler::GetOffsetOfObjectHeaderInlineSlots();
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015b6718,ObjectHeaderInliningPhase);
  if (bVar4) {
    Output::Print(
                 L"ObjectHeaderInlining: Re-optimizing the object. Moving auxSlots properties to ObjectHeader.\n"
                 );
    Output::Flush();
  }
  pcVar12 = (char *)((long)&(object->super_RecyclableObject).super_FinalizableObject.
                            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + (ulong)uVar5
                    );
  if ((this->super_DynamicTypeHandler).inlineSlotCapacity == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    pcVar11 = pcVar12;
    do {
      uVar2 = *(undefined8 *)
               ((long)&(&(object->super_RecyclableObject).super_FinalizableObject)[uVar10].
                       super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + (ulong)uVar1);
      Memory::Recycler::WBSetBit(pcVar11);
      *(undefined8 *)pcVar11 = uVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar11);
      uVar10 = uVar10 + 1;
      pcVar11 = pcVar11 + 8;
    } while (uVar10 < (this->super_DynamicTypeHandler).inlineSlotCapacity);
  }
  pcVar11 = pcVar12 + (uVar10 & 0xffff) * 8;
  Memory::Recycler::WBSetBit(pcVar11);
  *(Var *)pcVar11 = pvVar8;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar11);
  pcVar12 = pcVar12 + (ulong)((int)uVar10 + 1U & 0xffff) * 8;
  Memory::Recycler::WBSetBit(pcVar12);
  *(Var *)pcVar12 = pvVar9;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar12);
  iVar6 = (*((((this->predecessorType).ptr)->typeHandler).ptr)->_vptr_DynamicTypeHandler[0x4e])();
  if (iVar6 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,899,
                                "(this->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler())"
                                ,"this->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler()"
                               );
    if (!bVar4) goto LAB_00dbe529;
    *puVar7 = 0;
  }
  if ((Type)((short)uVar10 + 2U) !=
      ((((this->predecessorType).ptr)->typeHandler).ptr)->inlineSlotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,900,
                                "(propertyIndex == ((PathTypeHandlerBase*)this->GetPredecessorType()->GetTypeHandler())->GetInlineSlotCapacity())"
                                ,
                                "propertyIndex == ((PathTypeHandlerBase*)this->GetPredecessorType()->GetTypeHandler())->GetInlineSlotCapacity()"
                               );
    if (!bVar4) {
LAB_00dbe529:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  return;
}

Assistant:

void PathTypeHandlerBase::MoveAuxSlotsToObjectHeader(DynamicObject *const object)
    {
        Assert(object);
        AssertMsg(!this->IsObjectHeaderInlinedTypeHandler(), "Already ObjectHeaderInlined?");
        AssertMsg(!object->HasObjectArray(), "Can't move auxSlots to inline when we have ObjectArray");

        // When transition from ObjectHeaderInlined to auxSlot happend 2 properties where moved from inlineSlot to auxSlot
        // as we have to have space for auxSlot and objectArray (see DynamicTypeHandler::AdjustSlots). And then the new
        // property was added at 3rd index in auxSlot
        AssertMsg(this->GetUnusedBytesValue() - this->GetInlineSlotCapacity() == 3, "Should have only 3 values in auxSlot");

        // Get the auxSlot[0] and auxSlot[1] value as we will over write it
        Var auxSlotZero = object->GetAuxSlot(0);
        Var auxSlotOne = object->GetAuxSlot(1);

#ifdef EXPLICIT_FREE_SLOTS
        Var auxSlots = object->auxSlots;
        const int auxSlotsCapacity = this->GetSlotCapacity() - this->GetInlineSlotCapacity();
#endif
        // Move all current inline slots up to object header inline offset
        Var *const oldInlineSlots = reinterpret_cast<Var *>(reinterpret_cast<uintptr_t>(object) + this->GetOffsetOfInlineSlots());
        Field(Var) *const newInlineSlots = reinterpret_cast<Field(Var) *>(reinterpret_cast<uintptr_t>(object) + this->GetOffsetOfObjectHeaderInlineSlots());

        PHASE_PRINT_TRACE1(ObjectHeaderInliningPhase, _u("ObjectHeaderInlining: Re-optimizing the object. Moving auxSlots properties to ObjectHeader.\n"));

        PropertyIndex propertyIndex = 0;
        while (propertyIndex < this->GetInlineSlotCapacity())
        {
            newInlineSlots[propertyIndex] = oldInlineSlots[propertyIndex];
            propertyIndex++;
        }

        // auxSlot should only have 2 entry, move that to inlineSlot
        newInlineSlots[propertyIndex++] = auxSlotZero;
        newInlineSlots[propertyIndex++] = auxSlotOne;

#ifdef EXPLICIT_FREE_SLOTS
        object->GetRecycler()->ExplicitFreeNonLeaf(auxSlots, auxSlotsCapacity * sizeof(Var));
#endif

        Assert(this->GetPredecessorType()->GetTypeHandler()->IsPathTypeHandler());
        Assert(propertyIndex == ((PathTypeHandlerBase*)this->GetPredecessorType()->GetTypeHandler())->GetInlineSlotCapacity());
    }